

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execAddqEa<(moira::Instr)121,(moira::Mode)7,(moira::Size)2>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 val;
  undefined8 in_RAX;
  byte bVar2;
  u32 data;
  u32 ea;
  
  _data = in_RAX;
  bVar1 = readOp<(moira::Mode)7,(moira::Size)2,0ul>(this,opcode & 7,&ea,&data);
  if (bVar1) {
    bVar2 = 8;
    if ((opcode & 0xe00) != 0) {
      bVar2 = (byte)(opcode >> 9) & 7;
    }
    val = addsub<(moira::Instr)121,(moira::Size)2>(this,(uint)bVar2,data);
    prefetch<0ul>(this);
    writeM<(moira::MemSpace)1,(moira::Size)2,4ul>(this,ea,val);
  }
  return;
}

Assistant:

void
Moira::execAddqEa(u16 opcode)
{
    i8  src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);

    u32 ea, data, result;
    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;

    if (src == 0) src = 8;
    result = addsub<I,S>(src, data);
    prefetch();

    writeOp<M,S, POLLIPL>(dst, ea, result);
}